

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peleenetssd_seg.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *pfVar1;
  int iVar2;
  char *pcVar3;
  float fVar4;
  int *piVar5;
  pointer pOVar6;
  void *__ptr;
  Allocator *pAVar7;
  int iVar8;
  char cVar9;
  int iVar10;
  float fVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int i;
  long lVar21;
  float fVar22;
  long lVar23;
  __m128 t_2;
  __m128 t;
  allocator local_3a9;
  ulong local_3a8;
  int baseLine;
  Extractor ex;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  float mean_vals [3];
  float local_330;
  int local_32c;
  Mat local_328;
  Object object;
  Mat local_288;
  Mat image;
  undefined4 local_230;
  int iStack_22c;
  size_t local_228;
  Allocator *local_218;
  long *local_1f0;
  Option local_1d8;
  Mat m;
  int local_190;
  int local_18c;
  uchar *local_188;
  Net peleenet;
  
  if (argc == 2) {
    pcVar3 = argv[1];
    std::__cxx11::string::string((string *)&peleenet,pcVar3,(allocator *)&image);
    cv::imread((string *)&m,(int)&peleenet);
    std::__cxx11::string::~string((string *)&peleenet);
    cVar9 = cv::Mat::empty();
    if (cVar9 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_288.cstep = 0;
      local_288.data = (void *)0x0;
      local_288.refcount._0_4_ = 0;
      local_288.refcount._4_4_ = 0;
      local_288.elemsize._0_4_ = 0;
      local_288._20_8_ = 0;
      local_288.allocator = (Allocator *)0x0;
      local_288.dims = 0;
      local_288.w = 0;
      local_288.h = 0;
      local_288.d = 0;
      local_288.c = 0;
      ncnn::Net::Net(&peleenet);
      peleenet.opt.use_vulkan_compute = true;
      iVar10 = ncnn::Net::load_param(&peleenet,"pelee.param");
      if ((iVar10 != 0) || (iVar10 = ncnn::Net::load_model(&peleenet,"pelee.bin"), iVar10 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_188,2,local_18c,local_190,0x130,0x130,(Allocator *)0x0);
      mean_vals[0] = 103.9;
      mean_vals[1] = 116.7;
      mean_vals[2] = 123.6;
      norm_vals[0] = 0.017;
      norm_vals[1] = 0.017;
      norm_vals[2] = 0.017;
      ncnn::Mat::substract_mean_normalize((Mat *)&image,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",(Mat *)&image);
      local_328.cstep = 0;
      local_328.data = (void *)0x0;
      local_328.refcount._0_4_ = 0;
      local_328.refcount._4_4_ = 0;
      local_328.elemsize._0_4_ = 0;
      local_328.elemsize._4_4_ = 0;
      local_328.elempack = 0;
      local_328.allocator = (Allocator *)0x0;
      local_328.dims = 0;
      local_328.w = 0;
      local_328.h = 0;
      local_328.d = 0;
      local_328.c = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&local_328,0);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      local_3a8 = CONCAT44(local_3a8._4_4_,(float)local_190);
      for (lVar21 = 0; lVar21 < local_328.h; lVar21 = lVar21 + 1) {
        lVar15 = local_328.w * lVar21 *
                 CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
        object.label = (int)*(float *)((long)local_328.data + lVar15);
        object.prob = *(float *)((long)local_328.data + lVar15 + 4);
        object.rect.x = *(float *)((long)local_328.data + lVar15 + 8) * (float)local_18c;
        object.rect.y = *(float *)((long)local_328.data + lVar15 + 0xc) * (float)local_3a8;
        object.rect.width =
             *(float *)((long)local_328.data + lVar15 + 0x10) * (float)local_18c - object.rect.x;
        object.rect.height =
             *(float *)((long)local_328.data + lVar15 + 0x14) * (float)local_3a8 - object.rect.y;
        std::vector<Object,_std::allocator<Object>_>::push_back(&objects,&object);
      }
      object.rect.x = 0.0;
      object.rect.y = 0.0;
      object.rect.width = 0.0;
      object.rect.height = 0.0;
      object.label = 0;
      object.prob = 0.0;
      ncnn::Extractor::extract(&ex,"sigmoid",(Mat *)&object,0);
      ncnn::Option::Option(&local_1d8);
      ncnn::resize_bilinear((Mat *)&object,&local_288,local_18c,local_190,&local_1d8);
      piVar5 = (int *)CONCAT44(object.rect.height,object.rect.width);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          free((void *)object.rect._0_8_);
        }
      }
      piVar5 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_328.allocator == (Allocator *)0x0) {
            free(local_328.data);
          }
          else {
            (*(local_328.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar5 = (int *)CONCAT44(iStack_22c,local_230);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_218 == (Allocator *)0x0) {
            free(_image);
          }
          else {
            (*local_218->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&peleenet);
      iVar8 = local_288.h;
      iVar10 = local_288.w;
      pAVar7 = local_288.allocator;
      __ptr = local_288.data;
      piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      uVar13 = (ulong)(uint)local_288.w;
      uVar16 = (ulong)(uint)local_288.h;
      iVar17 = local_288.c;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      cv::Mat::clone();
      lVar21 = 0;
      uVar20 = 0;
      while (pOVar6 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start,
            uVar20 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                   _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        local_3a8 = uVar20;
        fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                SUB84((double)*(float *)((long)&(objects.
                                                 super__Vector_base<Object,_std::allocator<Object>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->prob +
                                        lVar21),0),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                  lVar21),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar21),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).width +
                                  lVar21),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).height
                                  + lVar21),
                (ulong)*(uint *)((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->label + lVar21)
               );
        local_328.elemsize._0_4_ = 0;
        local_328.elemsize._4_4_ = 0;
        local_328.data = (void *)CONCAT44(local_328.data._4_4_,0x3010000);
        local_328.refcount = (int *)&image;
        pfVar1 = (float *)((long)&(pOVar6->rect).x + lVar21);
        ex._vptr_Extractor._0_4_ = (int)ROUND(*pfVar1);
        ex._vptr_Extractor._4_4_ = (int)ROUND(pfVar1[1]);
        ex.d._0_4_ = (int)ROUND(pfVar1[2]);
        ex.d._4_4_ = (int)ROUND(pfVar1[3]);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&peleenet);
        peleenet._vptr_Net = (_func_int **)0x406fe00000000000;
        peleenet.opt.lightmode = false;
        peleenet.opt.use_shader_pack8 = false;
        peleenet.opt.use_subgroup_ops = false;
        peleenet.opt.use_reserved_0 = false;
        peleenet.opt.num_threads = 0;
        peleenet.opt.blob_allocator = (Allocator *)0x0;
        peleenet.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle(&local_328,&ex,&peleenet,1,8,0);
        sprintf((char *)&peleenet,"%s %.1f%%",
                SUB84((double)(*(float *)((long)&pOVar6->prob + lVar21) * 100.0),0),
                _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEN4ncnn3MatEE11class_names_rel
                + *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEN4ncnn3MatEE11class_names_rel
                          + (long)*(int *)((long)&pOVar6->label + lVar21) * 4));
        baseLine = 0;
        std::__cxx11::string::string((string *)&local_328,(char *)&peleenet,(allocator *)&local_1d8)
        ;
        cv::getTextSize((string *)norm_vals,(int)&local_328,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)&local_328);
        fVar11 = (float)(int)*(float *)((long)&(pOVar6->rect).x + lVar21);
        fVar22 = (float)(int)((*(float *)((long)&(pOVar6->rect).y + lVar21) -
                              (float)(int)norm_vals[1]) - (float)baseLine);
        if ((int)fVar22 < 1) {
          fVar22 = 0.0;
        }
        fVar4 = (float)(iStack_22c - (int)norm_vals[0]);
        if ((int)norm_vals[0] + (int)fVar11 <= iStack_22c) {
          fVar4 = fVar11;
        }
        local_1d8.workspace_allocator = (Allocator *)0x0;
        local_1d8.lightmode = false;
        local_1d8.use_shader_pack8 = false;
        local_1d8.use_subgroup_ops = true;
        local_1d8.use_reserved_0 = true;
        local_1d8.blob_allocator = (Allocator *)&image;
        mean_vals[1] = fVar22;
        mean_vals[0] = fVar4;
        mean_vals[2] = norm_vals[0];
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_328);
        local_328.data = (void *)0x406fe00000000000;
        local_328.refcount._0_4_ = 0;
        local_328.refcount._4_4_ = 0x406fe000;
        local_328.elemsize._0_4_ = 0;
        local_328.elemsize._4_4_ = 0x406fe000;
        local_328.elempack = 0;
        local_328._28_4_ = 0;
        cv::rectangle(&local_1d8,mean_vals,&local_328,0xffffffff,8,0);
        local_1d8.workspace_allocator = (Allocator *)0x0;
        local_1d8.lightmode = false;
        local_1d8.use_shader_pack8 = false;
        local_1d8.use_subgroup_ops = true;
        local_1d8.use_reserved_0 = true;
        local_1d8.blob_allocator = (Allocator *)&image;
        std::__cxx11::string::string((string *)&local_328,(char *)&peleenet,&local_3a9);
        local_32c = (int)fVar22 + (int)norm_vals[1];
        local_330 = fVar4;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&object);
        object.label = 0;
        object.prob = 0.0;
        object.rect.x = 0.0;
        object.rect.y = 0.0;
        object.rect.width = 0.0;
        object.rect.height = 0.0;
        cv::putText(0,&local_1d8,&local_328,&local_330,0,&object,1,8,0);
        std::__cxx11::string::~string((string *)&local_328);
        lVar21 = lVar21 + 0x18;
        uVar20 = local_3a8 + 1;
      }
      uVar18 = 0;
      uVar20 = (ulong)(uint)iVar17;
      if (iVar17 < 1) {
        uVar20 = uVar18;
      }
      if (iVar10 < 1) {
        uVar13 = uVar18;
      }
      if (iVar8 < 1) {
        uVar16 = uVar18;
      }
      iVar17 = 0;
      for (; uVar18 != uVar16; uVar18 = uVar18 + 1) {
        lVar15 = *local_1f0 * uVar18 + local_228;
        iVar12 = (int)uVar13 + iVar17;
        local_3a8 = CONCAT44(local_3a8._4_4_,iVar12);
        lVar21 = 0;
        for (lVar23 = (long)iVar17; lVar23 != iVar12; lVar23 = lVar23 + 1) {
          iVar17 = 0;
          fVar22 = 0.45;
          uVar14 = 0xffffffff;
          for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
            fVar11 = *(float *)((long)__ptr + (long)iVar17 * 4 + lVar23 * 4);
            if (fVar22 < fVar11) {
              uVar14 = uVar19 & 0xffffffff;
              fVar22 = fVar11;
            }
            iVar17 = iVar17 + iVar8 * iVar10;
          }
          if ((uint)uVar14 < 2) {
            uVar14 = (ulong)((uint)uVar14 * 3);
            iVar17 = *(int *)(&DAT_00536194 + uVar14 * 4);
            iVar2 = *(int *)(&DAT_00536198 + uVar14 * 4);
            *(byte *)(lVar15 + lVar21) =
                 (char)(*(int *)(&DAT_00536190 + uVar14 * 4) / 2) +
                 (*(byte *)(lVar15 + lVar21) >> 1);
            *(byte *)(lVar15 + 1 + lVar21) =
                 (char)(iVar17 / 2) + (*(byte *)(lVar15 + 1 + lVar21) >> 1);
            *(byte *)(lVar15 + 2 + lVar21) =
                 (char)(iVar2 / 2) + (*(byte *)(lVar15 + 2 + lVar21) >> 1);
          }
          lVar21 = lVar21 + 3;
        }
        iVar17 = iVar12;
      }
      std::__cxx11::string::string((string *)&peleenet,"image",(allocator *)&local_1d8);
      local_328.elemsize._0_4_ = 0;
      local_328.elemsize._4_4_ = 0;
      local_328.data = (void *)CONCAT44(local_328.data._4_4_,0x1010000);
      local_328.refcount = (int *)&image;
      cv::imshow((string *)&peleenet,(_InputArray *)&local_328);
      std::__cxx11::string::~string((string *)&peleenet);
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (pAVar7 == (Allocator *)0x0) {
            free(__ptr);
          }
          else {
            (*pAVar7->_vptr_Allocator[3])(pAVar7,__ptr);
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            free(local_288.data);
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
      iVar10 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar3);
      iVar10 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    iVar10 = -1;
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
  }
  return iVar10;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    ncnn::Mat seg_out;
    detect_peleenet(m, objects, seg_out);

    draw_objects(m, objects, seg_out);

    return 0;
}